

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_reseterror(HSQUIRRELVM v)

{
  SQObjectPtr::Null((SQObjectPtr *)v);
  return;
}

Assistant:

void sq_reseterror(HSQUIRRELVM v)
{
    v->_lasterror.Null();
}